

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::GetDirFromEnv_abi_cxx11_
          (string *__return_storage_ptr__,testing *this,
          initializer_list<const_char_*> environment_variables,char *fallback,char separator)

{
  char *__s;
  size_t sVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  long lVar2;
  allocator<char> local_51;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  lVar2 = 0;
  do {
    __s = (char *)environment_variables._M_len;
    if ((long)environment_variables._M_array << 3 == lVar2) {
LAB_0011e747:
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,__s,(allocator<char> *)&local_50);
      return __return_storage_ptr__;
    }
    __s = getenv(*(char **)(this + lVar2));
    if ((__s != (char *)0x0) && (*__s != '\0')) {
      sVar1 = strlen(__s);
      if (__s[sVar1 - 1] != '/') {
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_50,__s,&local_51);
        __str = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append(&local_50,1,'/');
        std::__cxx11::string::string((string *)__return_storage_ptr__,__str);
        std::__cxx11::string::~string((string *)&local_50);
        return __return_storage_ptr__;
      }
      goto LAB_0011e747;
    }
    lVar2 = lVar2 + 8;
  } while( true );
}

Assistant:

static std::string GetDirFromEnv(
    std::initializer_list<const char*> environment_variables,
    const char* fallback, char separator) {
  for (const char* variable_name : environment_variables) {
    const char* value = internal::posix::GetEnv(variable_name);
    if (value != nullptr && value[0] != '\0') {
      if (value[strlen(value) - 1] != separator) {
        return std::string(value).append(1, separator);
      }
      return value;
    }
  }
  return fallback;
}